

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string *virtual_path,string *disk_path)

{
  string sStack_98;
  string local_78;
  Mapping local_58;
  
  std::__cxx11::string::string((string *)&local_78,(string *)disk_path);
  CanonicalizePath(&sStack_98,&local_78);
  Mapping::Mapping(&local_58,virtual_path,&sStack_98);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::emplace_back<google::protobuf::compiler::DiskSourceTree::Mapping>(&this->mappings_,&local_58);
  Mapping::~Mapping(&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void DiskSourceTree::MapPath(const std::string& virtual_path,
                             const std::string& disk_path) {
  mappings_.push_back(Mapping(virtual_path, CanonicalizePath(disk_path)));
}